

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::createConnection<slang::ast::MultiPortSymbol>
          (PortConnectionBuilder *this,MultiPortSymbol *port,PropertyExprSyntax *syntax,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  Scope *this_00;
  Diagnostic *this_01;
  PortConnection *pPVar1;
  ExpressionSyntax *args_1;
  SourceRange sourceRange;
  ASTContext context;
  ASTContext local_58;
  
  if (port->isNullPort == true) {
    this_00 = this->scope;
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    this_01 = Scope::addDiag(this_00,(DiagCode)0x900006,sourceRange);
    Diagnostic::addNote(this_01,(DiagCode)0x50001,(port->super_Symbol).location);
    pPVar1 = BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
                       (&this->comp->super_BumpAllocator,port);
    return pPVar1;
  }
  local_58.scope.ptr = this->scope;
  local_58.lookupIndex = (this->lookupLocation).index;
  local_58.flags.m_bits = 0x20;
  local_58.instanceOrProc = (Symbol *)0x0;
  local_58.firstTempVar = (TempVarSymbol *)0x0;
  local_58.randomizeDetails = (RandomizeDetails *)0x0;
  local_58.assertionInstance = (AssertionInstanceDetails *)0x0;
  args_1 = ASTContext::requireSimpleExpr(&local_58,syntax);
  if (args_1 == (ExpressionSyntax *)0x0) {
    pPVar1 = BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
                       (&this->comp->super_BumpAllocator,port);
  }
  else {
    pPVar1 = BumpAllocator::
             emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,slang::syntax::ExpressionSyntax_const&>
                       (&this->comp->super_BumpAllocator,port,args_1);
    if (attributes._M_extent._M_extent_value._M_extent_value != 0) {
      Compilation::setAttributes(this->comp,pPVar1,attributes);
    }
  }
  return pPVar1;
}

Assistant:

PortConnection* createConnection(const TPort& port, const PropertyExprSyntax& syntax,
                                     std::span<const AttributeSymbol* const> attributes) {
        // If this is an empty port, it's an error to provide an expression.
        if (port.isNullPort) {
            auto& diag = scope.addDiag(diag::NullPortExpression, syntax.sourceRange());
            diag.addNote(diag::NoteDeclarationHere, port.location);
            return emptyConnection(port);
        }

        ASTContext context(scope, lookupLocation, ASTFlags::NonProcedural);
        auto exprSyntax = context.requireSimpleExpr(syntax);
        if (!exprSyntax)
            return emptyConnection(port);

        auto conn = comp.emplace<PortConnection>(port, *exprSyntax);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }